

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enc_sse2.c
# Opt level: O2

void FTransform_SSE2(uint8_t *src,uint8_t *ref,int16_t *out)

{
  ulong uVar1;
  undefined8 uVar2;
  ulong uVar3;
  undefined8 uVar4;
  ulong uVar5;
  undefined8 uVar6;
  ulong uVar7;
  undefined8 uVar8;
  undefined1 auVar9 [15];
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  undefined1 auVar17 [15];
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  undefined1 auVar27 [15];
  undefined1 auVar28 [15];
  undefined1 auVar29 [15];
  undefined1 auVar30 [15];
  undefined1 auVar31 [15];
  undefined1 auVar32 [15];
  undefined1 auVar33 [15];
  undefined1 auVar34 [15];
  undefined1 auVar35 [15];
  undefined1 auVar36 [15];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [15];
  unkuint9 Var42;
  undefined1 auVar43 [11];
  undefined1 auVar44 [15];
  unkuint9 Var45;
  undefined1 auVar46 [11];
  undefined1 auVar47 [15];
  unkuint9 Var48;
  undefined1 auVar49 [11];
  undefined1 auVar50 [15];
  undefined1 auVar51 [11];
  undefined1 auVar52 [15];
  undefined1 auVar53 [15];
  undefined1 auVar54 [15];
  undefined1 auVar55 [15];
  undefined1 auVar56 [15];
  undefined1 auVar57 [15];
  undefined1 auVar58 [15];
  undefined1 auVar59 [15];
  undefined1 auVar60 [16];
  undefined1 auVar64 [16];
  undefined1 auVar68 [16];
  undefined1 auVar72 [16];
  __m128i v32;
  __m128i v01;
  __m128i row23;
  __m128i row01;
  longlong alStack_58 [2];
  longlong local_48 [2];
  short local_38;
  short sStack_36;
  short sStack_34;
  short sStack_32;
  short sStack_30;
  short sStack_2e;
  short sStack_2c;
  short sStack_2a;
  short local_28;
  short sStack_26;
  short sStack_24;
  short sStack_22;
  short sStack_20;
  short sStack_1e;
  short sStack_1c;
  short sStack_1a;
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  
  uVar1 = *(ulong *)src;
  uVar2 = *(undefined8 *)(src + 0x20);
  auVar63._8_4_ = 0;
  auVar63._0_8_ = uVar1;
  auVar63._12_2_ = (short)(uVar1 >> 0x30);
  auVar63._14_2_ = (short)((ulong)uVar2 >> 0x30);
  auVar62._12_4_ = auVar63._12_4_;
  auVar62._8_2_ = 0;
  auVar62._0_8_ = uVar1;
  auVar62._10_2_ = (short)((ulong)uVar2 >> 0x20);
  auVar61._10_6_ = auVar62._10_6_;
  auVar61._8_2_ = (short)(uVar1 >> 0x20);
  auVar61._0_8_ = uVar1;
  auVar37._2_8_ = auVar61._8_8_;
  auVar37._0_2_ = (short)((ulong)uVar2 >> 0x10);
  auVar37._10_6_ = 0;
  auVar60._12_4_ = 0;
  auVar60._0_12_ = SUB1612(auVar37 << 0x30,4);
  auVar60 = auVar60 << 0x20;
  uVar3 = *(ulong *)(src + 0x40);
  uVar4 = *(undefined8 *)(src + 0x60);
  auVar67._8_4_ = 0;
  auVar67._0_8_ = uVar3;
  auVar67._12_2_ = (short)(uVar3 >> 0x30);
  auVar67._14_2_ = (short)((ulong)uVar4 >> 0x30);
  auVar66._12_4_ = auVar67._12_4_;
  auVar66._8_2_ = 0;
  auVar66._0_8_ = uVar3;
  auVar66._10_2_ = (short)((ulong)uVar4 >> 0x20);
  auVar65._10_6_ = auVar66._10_6_;
  auVar65._8_2_ = (short)(uVar3 >> 0x20);
  auVar65._0_8_ = uVar3;
  auVar38._2_8_ = auVar65._8_8_;
  auVar38._0_2_ = (short)((ulong)uVar4 >> 0x10);
  auVar38._10_6_ = 0;
  auVar64._12_4_ = 0;
  auVar64._0_12_ = SUB1612(auVar38 << 0x30,4);
  auVar64 = auVar64 << 0x20;
  uVar5 = *(ulong *)ref;
  uVar6 = *(undefined8 *)(ref + 0x20);
  auVar71._8_4_ = 0;
  auVar71._0_8_ = uVar5;
  auVar71._12_2_ = (short)(uVar5 >> 0x30);
  auVar71._14_2_ = (short)((ulong)uVar6 >> 0x30);
  auVar70._12_4_ = auVar71._12_4_;
  auVar70._8_2_ = 0;
  auVar70._0_8_ = uVar5;
  auVar70._10_2_ = (short)((ulong)uVar6 >> 0x20);
  auVar69._10_6_ = auVar70._10_6_;
  auVar69._8_2_ = (short)(uVar5 >> 0x20);
  auVar69._0_8_ = uVar5;
  auVar39._2_8_ = auVar69._8_8_;
  auVar39._0_2_ = (short)((ulong)uVar6 >> 0x10);
  auVar39._10_6_ = 0;
  auVar68._12_4_ = 0;
  auVar68._0_12_ = SUB1612(auVar39 << 0x30,4);
  auVar68 = auVar68 << 0x20;
  uVar7 = *(ulong *)(ref + 0x40);
  uVar8 = *(undefined8 *)(ref + 0x60);
  auVar75._8_4_ = 0;
  auVar75._0_8_ = uVar7;
  auVar75._12_2_ = (short)(uVar7 >> 0x30);
  auVar75._14_2_ = (short)((ulong)uVar8 >> 0x30);
  auVar74._12_4_ = auVar75._12_4_;
  auVar74._8_2_ = 0;
  auVar74._0_8_ = uVar7;
  auVar74._10_2_ = (short)((ulong)uVar8 >> 0x20);
  auVar73._10_6_ = auVar74._10_6_;
  auVar73._8_2_ = (short)(uVar7 >> 0x20);
  auVar73._0_8_ = uVar7;
  auVar40._2_8_ = auVar73._8_8_;
  auVar40._0_2_ = (short)((ulong)uVar8 >> 0x10);
  auVar40._10_6_ = 0;
  auVar72._12_4_ = 0;
  auVar72._0_12_ = SUB1612(auVar40 << 0x30,4);
  auVar72 = auVar72 << 0x20;
  auVar12[0xd] = 0;
  auVar12._0_13_ = auVar60._0_13_;
  auVar12[0xe] = (char)((ulong)uVar2 >> 0x18);
  auVar16[0xc] = (char)((ulong)uVar2 >> 0x10);
  auVar16._0_12_ = auVar60._0_12_;
  auVar16._13_2_ = auVar12._13_2_;
  auVar20[0xb] = 0;
  auVar20._0_11_ = auVar60._0_11_;
  auVar20._12_3_ = auVar16._12_3_;
  auVar24[10] = (char)(uVar1 >> 0x18);
  auVar24._0_10_ = auVar60._0_10_;
  auVar24._11_4_ = auVar20._11_4_;
  auVar28[9] = 0;
  auVar28._0_9_ = auVar60._0_9_;
  auVar28._10_5_ = auVar24._10_5_;
  auVar32[8] = (char)(uVar1 >> 0x10);
  auVar32._0_8_ = auVar60._0_8_;
  auVar32._9_6_ = auVar28._9_6_;
  auVar41._7_8_ = 0;
  auVar41._0_7_ = auVar32._8_7_;
  Var42 = CONCAT81(SUB158(auVar41 << 0x40,7),(char)((ulong)uVar2 >> 8));
  auVar52._9_6_ = 0;
  auVar52._0_9_ = Var42;
  auVar43._1_10_ = SUB1510(auVar52 << 0x30,5);
  auVar43[0] = (char)uVar2;
  auVar53._11_4_ = 0;
  auVar53._0_11_ = auVar43;
  auVar36[2] = (char)(uVar1 >> 8);
  auVar36._0_2_ = (ushort)uVar1;
  auVar36._3_12_ = SUB1512(auVar53 << 0x20,3);
  auVar9[0xd] = 0;
  auVar9._0_13_ = auVar64._0_13_;
  auVar9[0xe] = (char)((ulong)uVar4 >> 0x18);
  auVar13[0xc] = (char)((ulong)uVar4 >> 0x10);
  auVar13._0_12_ = auVar64._0_12_;
  auVar13._13_2_ = auVar9._13_2_;
  auVar17[0xb] = 0;
  auVar17._0_11_ = auVar64._0_11_;
  auVar17._12_3_ = auVar13._12_3_;
  auVar21[10] = (char)(uVar3 >> 0x18);
  auVar21._0_10_ = auVar64._0_10_;
  auVar21._11_4_ = auVar17._11_4_;
  auVar25[9] = 0;
  auVar25._0_9_ = auVar64._0_9_;
  auVar25._10_5_ = auVar21._10_5_;
  auVar29[8] = (char)(uVar3 >> 0x10);
  auVar29._0_8_ = auVar64._0_8_;
  auVar29._9_6_ = auVar25._9_6_;
  auVar44._7_8_ = 0;
  auVar44._0_7_ = auVar29._8_7_;
  Var45 = CONCAT81(SUB158(auVar44 << 0x40,7),(char)((ulong)uVar4 >> 8));
  auVar54._9_6_ = 0;
  auVar54._0_9_ = Var45;
  auVar46._1_10_ = SUB1510(auVar54 << 0x30,5);
  auVar46[0] = (char)uVar4;
  auVar55._11_4_ = 0;
  auVar55._0_11_ = auVar46;
  auVar33[2] = (char)(uVar3 >> 8);
  auVar33._0_2_ = (ushort)uVar3;
  auVar33._3_12_ = SUB1512(auVar55 << 0x20,3);
  auVar10[0xd] = 0;
  auVar10._0_13_ = auVar68._0_13_;
  auVar10[0xe] = (char)((ulong)uVar6 >> 0x18);
  auVar14[0xc] = (char)((ulong)uVar6 >> 0x10);
  auVar14._0_12_ = auVar68._0_12_;
  auVar14._13_2_ = auVar10._13_2_;
  auVar18[0xb] = 0;
  auVar18._0_11_ = auVar68._0_11_;
  auVar18._12_3_ = auVar14._12_3_;
  auVar22[10] = (char)(uVar5 >> 0x18);
  auVar22._0_10_ = auVar68._0_10_;
  auVar22._11_4_ = auVar18._11_4_;
  auVar26[9] = 0;
  auVar26._0_9_ = auVar68._0_9_;
  auVar26._10_5_ = auVar22._10_5_;
  auVar30[8] = (char)(uVar5 >> 0x10);
  auVar30._0_8_ = auVar68._0_8_;
  auVar30._9_6_ = auVar26._9_6_;
  auVar47._7_8_ = 0;
  auVar47._0_7_ = auVar30._8_7_;
  Var48 = CONCAT81(SUB158(auVar47 << 0x40,7),(char)((ulong)uVar6 >> 8));
  auVar56._9_6_ = 0;
  auVar56._0_9_ = Var48;
  auVar49._1_10_ = SUB1510(auVar56 << 0x30,5);
  auVar49[0] = (char)uVar6;
  auVar57._11_4_ = 0;
  auVar57._0_11_ = auVar49;
  auVar34[2] = (char)(uVar5 >> 8);
  auVar34._0_2_ = (ushort)uVar5;
  auVar34._3_12_ = SUB1512(auVar57 << 0x20,3);
  local_28 = ((ushort)uVar1 & 0xff) - ((ushort)uVar5 & 0xff);
  sStack_26 = auVar36._2_2_ - auVar34._2_2_;
  sStack_24 = auVar43._0_2_ - auVar49._0_2_;
  sStack_22 = (short)Var42 - (short)Var48;
  sStack_20 = auVar32._8_2_ - auVar30._8_2_;
  sStack_1e = auVar24._10_2_ - auVar22._10_2_;
  sStack_1c = auVar16._12_2_ - auVar14._12_2_;
  sStack_1a = (auVar12._13_2_ >> 8) - (auVar10._13_2_ >> 8);
  auVar11[0xd] = 0;
  auVar11._0_13_ = auVar72._0_13_;
  auVar11[0xe] = (char)((ulong)uVar8 >> 0x18);
  auVar15[0xc] = (char)((ulong)uVar8 >> 0x10);
  auVar15._0_12_ = auVar72._0_12_;
  auVar15._13_2_ = auVar11._13_2_;
  auVar19[0xb] = 0;
  auVar19._0_11_ = auVar72._0_11_;
  auVar19._12_3_ = auVar15._12_3_;
  auVar23[10] = (char)(uVar7 >> 0x18);
  auVar23._0_10_ = auVar72._0_10_;
  auVar23._11_4_ = auVar19._11_4_;
  auVar27[9] = 0;
  auVar27._0_9_ = auVar72._0_9_;
  auVar27._10_5_ = auVar23._10_5_;
  auVar31[8] = (char)(uVar7 >> 0x10);
  auVar31._0_8_ = auVar72._0_8_;
  auVar31._9_6_ = auVar27._9_6_;
  auVar50._7_8_ = 0;
  auVar50._0_7_ = auVar31._8_7_;
  Var42 = CONCAT81(SUB158(auVar50 << 0x40,7),(char)((ulong)uVar8 >> 8));
  auVar58._9_6_ = 0;
  auVar58._0_9_ = Var42;
  auVar51._1_10_ = SUB1510(auVar58 << 0x30,5);
  auVar51[0] = (char)uVar8;
  auVar59._11_4_ = 0;
  auVar59._0_11_ = auVar51;
  auVar35[2] = (char)(uVar7 >> 8);
  auVar35._0_2_ = (ushort)uVar7;
  auVar35._3_12_ = SUB1512(auVar59 << 0x20,3);
  local_38 = ((ushort)uVar3 & 0xff) - ((ushort)uVar7 & 0xff);
  sStack_36 = auVar33._2_2_ - auVar35._2_2_;
  sStack_34 = auVar46._0_2_ - auVar51._0_2_;
  sStack_32 = (short)Var45 - (short)Var42;
  sStack_30 = auVar29._8_2_ - auVar31._8_2_;
  sStack_2e = auVar21._10_2_ - auVar23._10_2_;
  sStack_2c = auVar13._12_2_ - auVar15._12_2_;
  sStack_2a = (auVar9._13_2_ >> 8) - (auVar11._13_2_ >> 8);
  FTransformPass1_SSE2((__m128i *)&local_28,(__m128i *)&local_38,&local_48,&alStack_58);
  FTransformPass2_SSE2(&local_48,&alStack_58,out);
  return;
}

Assistant:

static void FTransform_SSE2(const uint8_t* src, const uint8_t* ref,
                            int16_t* out) {
  const __m128i zero = _mm_setzero_si128();
  // Load src.
  const __m128i src0 = _mm_loadl_epi64((const __m128i*)&src[0 * BPS]);
  const __m128i src1 = _mm_loadl_epi64((const __m128i*)&src[1 * BPS]);
  const __m128i src2 = _mm_loadl_epi64((const __m128i*)&src[2 * BPS]);
  const __m128i src3 = _mm_loadl_epi64((const __m128i*)&src[3 * BPS]);
  // 00 01 02 03 *
  // 10 11 12 13 *
  // 20 21 22 23 *
  // 30 31 32 33 *
  // Shuffle.
  const __m128i src_0 = _mm_unpacklo_epi16(src0, src1);
  const __m128i src_1 = _mm_unpacklo_epi16(src2, src3);
  // 00 01 10 11 02 03 12 13 * * ...
  // 20 21 30 31 22 22 32 33 * * ...

  // Load ref.
  const __m128i ref0 = _mm_loadl_epi64((const __m128i*)&ref[0 * BPS]);
  const __m128i ref1 = _mm_loadl_epi64((const __m128i*)&ref[1 * BPS]);
  const __m128i ref2 = _mm_loadl_epi64((const __m128i*)&ref[2 * BPS]);
  const __m128i ref3 = _mm_loadl_epi64((const __m128i*)&ref[3 * BPS]);
  const __m128i ref_0 = _mm_unpacklo_epi16(ref0, ref1);
  const __m128i ref_1 = _mm_unpacklo_epi16(ref2, ref3);

  // Convert both to 16 bit.
  const __m128i src_0_16b = _mm_unpacklo_epi8(src_0, zero);
  const __m128i src_1_16b = _mm_unpacklo_epi8(src_1, zero);
  const __m128i ref_0_16b = _mm_unpacklo_epi8(ref_0, zero);
  const __m128i ref_1_16b = _mm_unpacklo_epi8(ref_1, zero);

  // Compute the difference.
  const __m128i row01 = _mm_sub_epi16(src_0_16b, ref_0_16b);
  const __m128i row23 = _mm_sub_epi16(src_1_16b, ref_1_16b);
  __m128i v01, v32;

  // First pass
  FTransformPass1_SSE2(&row01, &row23, &v01, &v32);

  // Second pass
  FTransformPass2_SSE2(&v01, &v32, out);
}